

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::fastcgi::async_read_headers(fastcgi *this,handler *h)

{
  pointer_type local_38;
  handler local_30;
  element_type *local_20;
  
  (*(this->super_connection)._vptr_connection[0xd])();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->super_connection).map_env_._M_t);
  self((fastcgi *)&stack0xffffffffffffffd8);
  mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
            ((offset_in_fastcgi_to_subr)&local_38,
             (shared_ptr<cppcms::impl::cgi::fastcgi> *)on_start_request,
             (callback<void_(const_std::error_code_&)> *)0x0);
  local_30.call_ptr.p_ = (pointer_type)(pointer_type)local_38.p_;
  if (local_38.p_ != (callable<void_(const_std::error_code_&)> *)0x0) {
    booster::atomic_counter::inc();
  }
  async_read_record(this,&local_30);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&local_30.call_ptr);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&local_38);
  if (local_20 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  return;
}

Assistant:

virtual void async_read_headers(handler const &h)
		{
			reset_all();
            connection::reset_all();
			async_read_record(mfunc_to_event_handler(&fastcgi::on_start_request,self(),h));
		}